

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O1

void __thiscall libtorrent::digest32<256L>::stream_out(digest32<256L> *this,ostream *os)

{
  difference_type in_RCX;
  span<const_char> in;
  string local_30;
  
  in.m_len = in_RCX;
  in.m_ptr = &DAT_00000020;
  aux::to_hex_abi_cxx11_(&local_30,(aux *)this,in);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void digest32<N>::stream_out(std::ostream& os) const
	{
		os << aux::to_hex(*this);
	}